

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agg_vpgen_clip_polygon.cpp
# Opt level: O1

void __thiscall agg::vpgen_clip_polygon::line_to(vpgen_clip_polygon *this,double x,double y)

{
  double dVar1;
  double dVar2;
  double dVar3;
  uint uVar4;
  uint uVar5;
  vpgen_clip_polygon *pvVar6;
  vpgen_clip_polygon *pvVar7;
  ulong uVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  
  *(undefined8 *)(this + 0x78) = 0;
  uVar4 = clipping_flags(this,x,y);
  if (*(uint *)(this + 0x30) == uVar4) {
    if (uVar4 != 0) goto LAB_0011b048;
    *(double *)(this + 0x38) = x;
    *(double *)(this + 0x58) = y;
    uVar5 = 1;
  }
  else {
    dVar1 = *(double *)(this + 0x20);
    dVar2 = *(double *)(this + 0x28);
    dVar3 = *(double *)this;
    dVar9 = *(double *)(this + 8);
    uVar8 = -(ulong)(x - dVar1 == 0.0);
    dVar10 = (double)(uVar8 & (~-(ulong)(dVar3 < dVar1) & 0x39b4484bfeebc2a0 |
                              -(ulong)(dVar3 < dVar1) & 0xb9b4484bfeebc2a0) |
                     ~uVar8 & (ulong)(x - dVar1));
    uVar8 = -(ulong)(y - dVar2 == 0.0);
    dVar11 = (double)(uVar8 & (~-(ulong)(dVar9 < dVar2) & 0x39b4484bfeebc2a0 |
                              -(ulong)(dVar9 < dVar2) & 0xb9b4484bfeebc2a0) |
                     ~uVar8 & (ulong)(y - dVar2));
    dVar12 = *(double *)(this + 0x10);
    if (dVar10 <= 0.0) {
      dVar12 = dVar3;
    }
    dVar3 = (double)(~-(ulong)(0.0 < dVar10) & (ulong)*(double *)(this + 0x10) |
                    -(ulong)(0.0 < dVar10) & (ulong)dVar3);
    dVar16 = dVar9;
    if (dVar11 <= 0.0) {
      dVar16 = *(double *)(this + 0x18);
    }
    dVar15 = (dVar3 - dVar1) / dVar10;
    dVar14 = (dVar16 - dVar2) / dVar11;
    dVar19 = dVar15;
    if (dVar14 <= dVar15) {
      dVar19 = dVar14;
    }
    uVar5 = 0;
    if (dVar19 <= 1.0) {
      dVar18 = dVar14;
      if (dVar14 <= dVar15) {
        dVar18 = dVar15;
      }
      if (dVar19 <= 0.0) {
        pvVar7 = this + 0x38;
        pvVar6 = this + 0x58;
      }
      else {
        pvVar7 = this + 0x40;
        *(double *)(this + 0x38) = dVar3;
        pvVar6 = this + 0x60;
        *(double *)(this + 0x58) = dVar16;
      }
      uVar5 = (uint)(dVar19 > 0.0);
      if (dVar18 <= 1.0) {
        dVar9 = (double)(~-(ulong)(0.0 < dVar11) & (ulong)dVar9 |
                        (ulong)*(double *)(this + 0x18) & -(ulong)(0.0 < dVar11));
        dVar13 = (dVar12 - dVar1) / dVar10;
        dVar17 = (dVar9 - dVar2) / dVar11;
        dVar19 = dVar13;
        if (dVar17 <= dVar13) {
          dVar19 = dVar17;
        }
        if ((0.0 < dVar18) || (0.0 < dVar19)) {
          if (dVar18 <= dVar19) {
            if (0.0 < dVar18) {
              if (dVar15 <= dVar14) {
                *(double *)pvVar7 = dVar14 * dVar10 + dVar1;
              }
              else {
                *(double *)pvVar7 = dVar3;
                dVar16 = dVar15 * dVar11 + dVar2;
              }
              pvVar7 = pvVar7 + 8;
              *(double *)pvVar6 = dVar16;
              pvVar6 = pvVar6 + 8;
              uVar5 = uVar5 + 1;
            }
            if (1.0 <= dVar19) {
              *(double *)pvVar7 = x;
              dVar9 = y;
            }
            else if (dVar17 <= dVar13) {
              *(double *)pvVar7 = dVar17 * dVar10 + dVar1;
            }
            else {
              *(double *)pvVar7 = dVar12;
              dVar9 = dVar13 * dVar11 + dVar2;
            }
            *(double *)pvVar6 = dVar9;
            uVar5 = uVar5 + 1;
          }
          else {
            if (dVar15 <= dVar14) {
              dVar9 = dVar16;
            }
            *(ulong *)pvVar7 =
                 ~-(ulong)(dVar14 < dVar15) & (ulong)dVar12 |
                 (ulong)dVar3 & -(ulong)(dVar14 < dVar15);
            *(double *)pvVar6 = dVar9;
            uVar5 = uVar5 + 1;
          }
        }
      }
    }
  }
  *(uint *)(this + 0x78) = uVar5;
LAB_0011b048:
  *(uint *)(this + 0x30) = uVar4;
  *(double *)(this + 0x20) = x;
  *(double *)(this + 0x28) = y;
  return;
}

Assistant:

void vpgen_clip_polygon::line_to(double x, double y)
    {
        m_vertex = 0;
        m_num_vertices = 0;
        unsigned flags = clipping_flags(x, y);

        if(m_clip_flags == flags)
        {
            if(flags == 0)
            {
                m_x[0] = x;
                m_y[0] = y;
                m_num_vertices = 1;
            }
        }
        else
        {
            m_num_vertices = clip_liang_barsky(m_x1, m_y1, 
                                               x, y, 
                                               m_clip_box, 
                                               m_x, m_y);
        }

        m_clip_flags = flags;
        m_x1 = x;
        m_y1 = y;
    }